

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFactorySystem.h
# Opt level: O0

void __thiscall ObjectFactorySystem::ObjectFactorySystem(ObjectFactorySystem *this)

{
  ObjectFactorySystem *this_local;
  
  IObjectFactorySystem::IObjectFactorySystem((IObjectFactorySystem *)this);
  *(code **)this = std::__cxx11::string::string;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
         *)(this + 8));
  std::vector<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_>::vector
            ((vector<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_> *)(this + 0x38));
  std::
  set<IObjectFactoryListener_*,_std::less<IObjectFactoryListener_*>,_std::allocator<IObjectFactoryListener_*>_>
  ::set((set<IObjectFactoryListener_*,_std::less<IObjectFactoryListener_*>,_std::allocator<IObjectFactoryListener_*>_>
         *)(this + 0x50));
  *(undefined8 *)(this + 0x80) = 0;
  *(undefined8 *)(this + 0x88) = 0;
  this[0x90] = (ObjectFactorySystem)0x1;
  *(undefined4 *)(this + 0x94) = 0;
  *(undefined4 *)(this + 0x98) = 0;
  std::vector<ObjectFactorySystem::HistoryPoint,_std::allocator<ObjectFactorySystem::HistoryPoint>_>
  ::vector((vector<ObjectFactorySystem::HistoryPoint,_std::allocator<ObjectFactorySystem::HistoryPoint>_>
            *)(this + 0xa0));
  return;
}

Assistant:

ObjectFactorySystem()
		: m_pLogger( 0 )
		, m_pRuntimeObjectSystem( 0 )
        , m_bTestSerialization(true)
		, m_HistoryMaxSize( 0 )
		, m_HistoryCurrentLocation( 0 )
 	{
	}